

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_5b0ff7::HandleArchiveCreateCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *key;
  bool bVar1;
  uint compressionLevel;
  int iVar2;
  iterator iVar3;
  bool bVar4;
  _Rb_tree_color compressType;
  string *this;
  long lVar5;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>
  __l;
  allocator_type local_2aa;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_2a9;
  string local_2a8;
  _Alloc_hider local_288;
  pointer local_280;
  cmTarCompression local_254 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  Arguments parsedArgs;
  undefined1 local_130 [16];
  code *local_120;
  code *local_118;
  size_t local_110;
  undefined1 auStack_108 [40];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_90;
  char *zipFileFormats [2];
  char *knownFormats [6];
  
  if ((anonymous_namespace)::
      HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::parser == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
    if (iVar2 != 0) {
      parsedArgs.Format.field_2._M_allocated_capacity = 0;
      parsedArgs.Format.field_2._8_8_ = 0;
      parsedArgs.Format._M_dataplus._M_p = (pointer)0x0;
      parsedArgs.Format._M_string_length = 0;
      parsedArgs.Output.field_2._M_allocated_capacity = 0;
      parsedArgs.Output.field_2._8_8_ = 0;
      parsedArgs.Output._M_dataplus._M_p = (pointer)0x0;
      parsedArgs.Output._M_string_length = 0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = (_Base_ptr)0x0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count =
           0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)0x0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = _S_red;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
           = 0;
      name.super_string_view._M_str = "OUTPUT";
      name.super_string_view._M_len = 6;
      cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name,0x30);
      name_00.super_string_view._M_str = "FORMAT";
      name_00.super_string_view._M_len = 6;
      cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_00,0x50);
      name_01.super_string_view._M_str = "COMPRESSION";
      name_01.super_string_view._M_len = 0xb;
      cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_01,0x70);
      name_02.super_string_view._M_str = "COMPRESSION_LEVEL";
      name_02.super_string_view._M_len = 0x11;
      cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_02,0x90);
      local_130._8_8_ = (ParseResult *)0x0;
      local_130._0_8_ = (ActionMap *)0xb0;
      local_118 = std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                  ::_M_invoke;
      local_120 = std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                  ::_M_manager;
      name_03._M_str = "MTIME";
      name_03._M_len = 5;
      ArgumentParser::Base::Bind((Base *)&parsedArgs,name_03,(KeywordAction *)local_130);
      std::_Function_base::~_Function_base((_Function_base *)local_130);
      local_130._8_8_ = (ParseResult *)0x0;
      local_130._0_8_ = (ActionMap *)0xd0;
      local_118 = std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                  ::_M_invoke;
      local_120 = std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                  ::_M_manager;
      name_04._M_str = "VERBOSE";
      name_04._M_len = 7;
      ArgumentParser::Base::Bind((Base *)&parsedArgs,name_04,(KeywordAction *)local_130);
      std::_Function_base::~_Function_base((_Function_base *)local_130);
      local_130._8_8_ = (ParseResult *)0x0;
      local_130._0_8_ = (ActionMap *)0xd8;
      local_118 = std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                  ::_M_invoke;
      local_120 = std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
                  ::_M_manager;
      name_05._M_str = "PATHS";
      name_05._M_len = 5;
      ArgumentParser::Base::Bind((Base *)&parsedArgs,name_05,(KeywordAction *)local_130);
      std::_Function_base::~_Function_base((_Function_base *)local_130);
      ArgumentParser::ActionMap::ActionMap
                ((ActionMap *)&HandleArchiveCreateCommand::parser,(ActionMap *)&parsedArgs);
      ArgumentParser::ActionMap::~ActionMap((ActionMap *)&parsedArgs);
      __cxa_atexit(ArgumentParser::Base::~Base,&HandleArchiveCreateCommand::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
  }
  local_120 = (code *)&unrecognizedArguments;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  knownFormats[1] =
       (char *)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
       & 0xffffffff00000000;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parsedArgs.Output._M_dataplus._M_p = (pointer)&parsedArgs.Output.field_2;
  parsedArgs.Output._M_string_length = 0;
  parsedArgs.Output.field_2._M_allocated_capacity =
       parsedArgs.Output.field_2._M_allocated_capacity & 0xffffffffffffff00;
  parsedArgs.Format._M_dataplus._M_p = (pointer)&parsedArgs.Format.field_2;
  parsedArgs.Format._M_string_length = 0;
  parsedArgs.Format.field_2._M_allocated_capacity =
       parsedArgs.Format.field_2._M_allocated_capacity & 0xffffffffffffff00;
  parsedArgs.Compression._M_dataplus._M_p = (pointer)&parsedArgs.Compression.field_2;
  parsedArgs.Compression._M_string_length = 0;
  parsedArgs.Compression.field_2._M_local_buf[0] = '\0';
  parsedArgs.CompressionLevel._M_dataplus._M_p = (pointer)&parsedArgs.CompressionLevel.field_2;
  parsedArgs.CompressionLevel._M_string_length = 0;
  knownFormats[0] =
       (char *)((args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 1);
  parsedArgs.CompressionLevel.field_2._M_local_buf[0] = '\0';
  parsedArgs.MTime.super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.
  _M_dataplus._M_p =
       (pointer)&parsedArgs.MTime.
                 super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.field_2;
  parsedArgs.MTime.super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.
  _M_string_length = 0;
  parsedArgs.MTime.super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.field_2.
  _M_local_buf[0] = '\0';
  parsedArgs.Verbose = false;
  parsedArgs.Paths.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parsedArgs.Paths.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parsedArgs.Paths.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_130._0_8_ = &HandleArchiveCreateCommand::parser;
  local_130._8_8_ = &parsedArgs;
  local_110 = 0;
  auStack_108._0_8_ = (char *)0x0;
  auStack_108._8_8_ = 0;
  auStack_108._16_8_ = 0;
  auStack_108._24_8_ = (void *)0x0;
  auStack_108._32_8_ = 0;
  local_e0.first._M_dataplus._M_p = (pointer)0x0;
  local_e0.first._M_string_length = 0;
  local_e0.first.field_2._M_local_buf[0] = false;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  local_118 = (code *)local_130._8_8_;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_130,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)knownFormats,0);
  std::_Function_base::~_Function_base((_Function_base *)(auStack_108 + 0x18));
  if (unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = ArgumentParser::ParseResult::MaybeReportError
                      (&parsedArgs.super_ParseResult,status->Makefile);
    if (bVar1) {
      cmSystemTools::s_FatalErrorOccurred = true;
      bVar4 = true;
      goto LAB_00219aab;
    }
    key = &parsedArgs.Format;
    knownFormats[4] = "raw";
    knownFormats[5] = "zip";
    knownFormats[2] = "pax";
    knownFormats[3] = "paxr";
    knownFormats[0] = "7zip";
    knownFormats[1] = "gnutar";
    if (parsedArgs.Format._M_string_length == 0) {
LAB_002196e6:
      zipFileFormats[0] = "7zip";
      zipFileFormats[1] = "zip";
      if (parsedArgs.Compression._M_string_length != 0) {
        bVar1 = ::cm::
                contains<const_char_*[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&zipFileFormats,key);
        if (bVar1) {
          local_130._0_8_ = (ActionMap *)0xf;
          local_130._8_8_ = "archive format ";
          local_288._M_p = (pointer)parsedArgs.Format._M_string_length;
          local_280 = parsedArgs.Format._M_dataplus._M_p;
          cmStrCat<char[40]>(&local_2a8,(cmAlphaNum *)local_130,(cmAlphaNum *)&local_288,
                             (char (*) [40])" does not support COMPRESSION arguments");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00219a95;
        }
      }
      if ((anonymous_namespace)::
          HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::compressionTypeMap_abi_cxx11_ == '\0') {
        iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                     ::compressionTypeMap_abi_cxx11_);
        if (iVar2 != 0) {
          local_288._M_p._0_4_ = 4;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
                      *)local_130,(char (*) [5])0x67aceb,(cmTarCompression *)&local_288);
          local_2a8._M_dataplus._M_p._0_4_ = TarCompressBZip2;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[6],_cmSystemTools::cmTarCompression,_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
                      *)auStack_108,(char (*) [6])"BZip2",(cmTarCompression *)&local_2a8);
          local_254[2] = 0;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                    (&local_e0,(char (*) [5])"GZip",local_254 + 2);
          local_254[1] = 2;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[3],_cmSystemTools::cmTarCompression,_true>
                    (&local_b8,(char (*) [3])"XZ",local_254 + 1);
          local_254[0] = TarCompressZstd;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                    (&local_90,(char (*) [5])"Zstd",local_254);
          __l._M_len = 5;
          __l._M_array = (iterator)local_130;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
          ::map(&(anonymous_namespace)::
                 HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                 ::compressionTypeMap_abi_cxx11_,__l,&local_2a9,&local_2aa);
          lVar5 = 0xa0;
          do {
            std::__cxx11::string::~string((string *)(local_130 + lVar5));
            lVar5 = lVar5 + -0x28;
          } while (lVar5 != -0x28);
          __cxa_atexit(std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
                       ::~map,&(anonymous_namespace)::
                               HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::compressionTypeMap_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&(anonymous_namespace)::
                               HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::compressionTypeMap_abi_cxx11_);
        }
      }
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
              ::find(&(anonymous_namespace)::
                      HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                      ::compressionTypeMap_abi_cxx11_._M_t,&parsedArgs.Compression);
      if ((_Rb_tree_header *)iVar3._M_node ==
          &(anonymous_namespace)::
           HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
           ::compressionTypeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        if (parsedArgs.Compression._M_string_length != 0) {
          local_130._0_8_ = &DAT_00000011;
          local_130._8_8_ = "compression type ";
          local_288._M_p = (pointer)parsedArgs.Compression._M_string_length;
          local_280 = parsedArgs.Compression._M_dataplus._M_p;
          cmStrCat<char[18]>(&local_2a8,(cmAlphaNum *)local_130,(cmAlphaNum *)&local_288,
                             (char (*) [18])0x6b9962);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00219a95;
        }
        compressType = 4;
      }
      else {
        compressType = iVar3._M_node[2]._M_color;
      }
      if (parsedArgs.CompressionLevel._M_string_length == 0) {
        compressionLevel = 0;
LAB_0021996e:
        if (parsedArgs.Paths.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            parsedArgs.Paths.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_130,"ARCHIVE_CREATE requires a non-empty list of PATHS",
                     (allocator<char> *)&local_288);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          this = (string *)local_130;
          goto LAB_00219a9a;
        }
        bVar1 = cmSystemTools::CreateTar
                          (&parsedArgs.Output,
                           &parsedArgs.Paths.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ,compressType,parsedArgs.Verbose,
                           &parsedArgs.MTime.
                            super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,
                           key,compressionLevel);
        bVar4 = true;
        if (bVar1) goto LAB_00219aab;
        local_130._0_8_ = (ActionMap *)0x14;
        local_130._8_8_ = "failed to compress: ";
        local_288._M_p = (pointer)parsedArgs.Output._M_string_length;
        local_280 = parsedArgs.Output._M_dataplus._M_p;
        cmStrCat<>(&local_2a8,(cmAlphaNum *)local_130,(cmAlphaNum *)&local_288);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else if ((parsedArgs.CompressionLevel._M_string_length == 1) ||
              ((int)*parsedArgs.CompressionLevel._M_dataplus._M_p - 0x30U < 10)) {
        compressionLevel = std::__cxx11::stoi(&parsedArgs.CompressionLevel,(size_t *)0x0,10);
        if (compressionLevel < 10) {
          if (compressType != 4) goto LAB_0021996e;
          local_130._0_8_ = (ActionMap *)0x39;
          local_130._8_8_ = "compression level is not supported for compression \"None\"";
          local_288._M_p = (pointer)parsedArgs.Compression._M_string_length;
          local_280 = parsedArgs.Compression._M_dataplus._M_p;
          cmStrCat<>(&local_2a8,(cmAlphaNum *)local_130,(cmAlphaNum *)&local_288);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else {
          local_130._0_8_ = (ActionMap *)0x12;
          local_130._8_8_ = "compression level ";
          local_288._M_p = (pointer)parsedArgs.CompressionLevel._M_string_length;
          local_280 = parsedArgs.CompressionLevel._M_dataplus._M_p;
          cmStrCat<char[27]>(&local_2a8,(cmAlphaNum *)local_130,(cmAlphaNum *)&local_288,
                             (char (*) [27])" should be in range 0 to 9");
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
      }
      else {
        local_130._0_8_ = (ActionMap *)0x12;
        local_130._8_8_ = "compression level ";
        local_288._M_p = (pointer)parsedArgs.CompressionLevel._M_string_length;
        local_280 = parsedArgs.CompressionLevel._M_dataplus._M_p;
        cmStrCat<char[27]>(&local_2a8,(cmAlphaNum *)local_130,(cmAlphaNum *)&local_288,
                           (char (*) [27])" should be in range 0 to 9");
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
    else {
      bVar1 = ::cm::
              contains<const_char_*[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&knownFormats,key);
      if (bVar1) goto LAB_002196e6;
      local_130._0_8_ = (ActionMap *)0xf;
      local_130._8_8_ = "archive format ";
      local_288._M_p = (pointer)parsedArgs.Format._M_string_length;
      local_280 = parsedArgs.Format._M_dataplus._M_p;
      cmStrCat<char[15]>(&local_2a8,(cmAlphaNum *)local_130,(cmAlphaNum *)&local_288,
                         (char (*) [15])0x6d58c9);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
LAB_00219a95:
    this = (string *)&local_2a8;
  }
  else {
    local_130._0_8_ = &DAT_00000018;
    local_130._8_8_ = (long)"CONFIGURE Unrecognized argument: \"" + 10;
    knownFormats[1] =
         ((unrecognizedArguments.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    knownFormats[0] =
         (char *)(unrecognizedArguments.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    cmStrCat<char[2]>((string *)&local_288,(cmAlphaNum *)local_130,(cmAlphaNum *)knownFormats,
                      (char (*) [2])0x6735bd);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    this = (string *)&local_288;
  }
LAB_00219a9a:
  std::__cxx11::string::~string(this);
  cmSystemTools::s_FatalErrorOccurred = true;
  bVar4 = false;
LAB_00219aab:
  HandleArchiveCreateCommand::Arguments::~Arguments(&parsedArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unrecognizedArguments);
  return bVar4;
}

Assistant:

bool HandleArchiveCreateCommand(std::vector<std::string> const& args,
                                cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    std::string Output;
    std::string Format;
    std::string Compression;
    std::string CompressionLevel;
    // "MTIME" should require one value, but it has long been accidentally
    // accepted without one and treated as if an empty value were given.
    // Fixing this would require a policy.
    ArgumentParser::Maybe<std::string> MTime;
    bool Verbose = false;
    // "PATHS" requires at least one value, but use a custom check below.
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Paths;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("OUTPUT"_s, &Arguments::Output)
      .Bind("FORMAT"_s, &Arguments::Format)
      .Bind("COMPRESSION"_s, &Arguments::Compression)
      .Bind("COMPRESSION_LEVEL"_s, &Arguments::CompressionLevel)
      .Bind("MTIME"_s, &Arguments::MTime)
      .Bind("VERBOSE"_s, &Arguments::Verbose)
      .Bind("PATHS"_s, &Arguments::Paths);

  std::vector<std::string> unrecognizedArguments;
  auto parsedArgs =
    parser.Parse(cmMakeRange(args).advance(1), &unrecognizedArguments);
  auto argIt = unrecognizedArguments.begin();
  if (argIt != unrecognizedArguments.end()) {
    status.SetError(cmStrCat("Unrecognized argument: \"", *argIt, "\""));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  const char* knownFormats[] = {
    "7zip", "gnutar", "pax", "paxr", "raw", "zip"
  };

  if (!parsedArgs.Format.empty() &&
      !cm::contains(knownFormats, parsedArgs.Format)) {
    status.SetError(
      cmStrCat("archive format ", parsedArgs.Format, " not supported"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  const char* zipFileFormats[] = { "7zip", "zip" };
  if (!parsedArgs.Compression.empty() &&
      cm::contains(zipFileFormats, parsedArgs.Format)) {
    status.SetError(cmStrCat("archive format ", parsedArgs.Format,
                             " does not support COMPRESSION arguments"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  static std::map<std::string, cmSystemTools::cmTarCompression>
    compressionTypeMap = { { "None", cmSystemTools::TarCompressNone },
                           { "BZip2", cmSystemTools::TarCompressBZip2 },
                           { "GZip", cmSystemTools::TarCompressGZip },
                           { "XZ", cmSystemTools::TarCompressXZ },
                           { "Zstd", cmSystemTools::TarCompressZstd } };

  cmSystemTools::cmTarCompression compress = cmSystemTools::TarCompressNone;
  auto typeIt = compressionTypeMap.find(parsedArgs.Compression);
  if (typeIt != compressionTypeMap.end()) {
    compress = typeIt->second;
  } else if (!parsedArgs.Compression.empty()) {
    status.SetError(cmStrCat("compression type ", parsedArgs.Compression,
                             " is not supported"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  int compressionLevel = 0;
  if (!parsedArgs.CompressionLevel.empty()) {
    if (parsedArgs.CompressionLevel.size() != 1 &&
        !std::isdigit(parsedArgs.CompressionLevel[0])) {
      status.SetError(cmStrCat("compression level ",
                               parsedArgs.CompressionLevel,
                               " should be in range 0 to 9"));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    compressionLevel = std::stoi(parsedArgs.CompressionLevel);
    if (compressionLevel < 0 || compressionLevel > 9) {
      status.SetError(cmStrCat("compression level ",
                               parsedArgs.CompressionLevel,
                               " should be in range 0 to 9"));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    if (compress == cmSystemTools::TarCompressNone) {
      status.SetError(cmStrCat("compression level is not supported for "
                               "compression \"None\"",
                               parsedArgs.Compression));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  }

  if (parsedArgs.Paths.empty()) {
    status.SetError("ARCHIVE_CREATE requires a non-empty list of PATHS");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (!cmSystemTools::CreateTar(parsedArgs.Output, parsedArgs.Paths, compress,
                                parsedArgs.Verbose, parsedArgs.MTime,
                                parsedArgs.Format, compressionLevel)) {
    status.SetError(cmStrCat("failed to compress: ", parsedArgs.Output));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  return true;
}